

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,monster *mon)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  monster_spell *pmVar6;
  wchar_t element_1;
  monster_spell *spell_1;
  timed_failure *ptStack_78;
  _Bool resisted;
  timed_failure *f;
  wchar_t raw_resist;
  wchar_t element;
  effect *effect;
  monster_spell *spell;
  bitflag local_4d;
  wchar_t restore_chance;
  bitflag backup [13];
  wchar_t lowest_resist;
  _Bool smart;
  mon_spell_info *info;
  monster *mon_local;
  element_info *el_local;
  bitflag *pflags_local;
  bitflag *flags_local;
  bitflag *spells_local;
  
  backup[0xc] = monster_is_smart(mon);
  backup[5] = 'd';
  backup[6] = '\0';
  backup[7] = '\0';
  backup[8] = '\0';
  flag_wipe(&local_4d,0xd);
  _lowest_resist = mon_spell_types;
  do {
    if (0x60 < _lowest_resist->index) {
      iVar4 = flag_count(spells,0xd);
      if (((backup[0xc] & 1) != 0) && (uVar5 = Rand_div(iVar4 + 1), uVar5 == 0)) {
        for (_lowest_resist = mon_spell_types; _lowest_resist->index < 0x61;
            _lowest_resist = _lowest_resist + 1) {
          pmVar6 = monster_spell_by_index((uint)_lowest_resist->index);
          if (((pmVar6 != (monster_spell *)0x0) &&
              (_Var3 = flag_has_dbg(&local_4d,0xd,(uint)_lowest_resist->index,"backup","info->index"
                                   ), _Var3)) &&
             (100 - el[pmVar6->effect->subtype].res_level == backup._5_4_)) {
            flag_on_dbg(spells,0xd,(uint)_lowest_resist->index,"spells","info->index");
          }
        }
      }
      return;
    }
    pmVar6 = monster_spell_by_index((uint)_lowest_resist->index);
    if ((pmVar6 != (monster_spell *)0x0) &&
       (_Var3 = flag_has_dbg(spells,0xd,(uint)_lowest_resist->index,"spells","info->index"), _Var3))
    {
      _raw_resist = pmVar6->effect;
      if ((_lowest_resist->type & 7U) == 0) {
        for (; _raw_resist != (effect *)0x0; _raw_resist = _raw_resist->next) {
          if ((((backup[0xc] & 1) != 0) || (uVar5 = Rand_div(3), uVar5 != 0)) &&
             (_raw_resist->index == 10)) {
            bVar2 = false;
            if ((_raw_resist->subtype < L'\0') || (L'4' < _raw_resist->subtype)) {
              __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-spell.c"
                            ,0x205,
                            "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                           );
            }
            ptStack_78 = timed_effects[_raw_resist->subtype].fail;
            while( true ) {
              bVar1 = false;
              if (ptStack_78 != (timed_failure *)0x0) {
                bVar1 = (bool)(bVar2 ^ 1);
              }
              if (!bVar1) break;
              switch(ptStack_78->code) {
              case 1:
                _Var3 = flag_has_dbg(flags,6,ptStack_78->idx,"flags","f->idx");
                if (_Var3) {
                  bVar2 = true;
                }
                break;
              case 2:
                if (el[ptStack_78->idx].res_level < 0x51) {
                  bVar2 = true;
                }
                break;
              case 3:
                if (100 < el[ptStack_78->idx].res_level) {
                  bVar2 = true;
                }
                break;
              case 4:
                _Var3 = flag_has_dbg(pflags,10,ptStack_78->idx,"pflags","f->idx");
                if (_Var3) {
                  bVar2 = true;
                }
                break;
              case 5:
              }
              ptStack_78 = ptStack_78->next;
            }
            if (bVar2) break;
          }
          if (((((backup[0xc] & 1) != 0) || (uVar5 = Rand_div(2), uVar5 == 0)) &&
              (_raw_resist->index == 0x17)) &&
             (_Var3 = flag_has_dbg(pflags,10,0x1d,"pflags","PF_NO_MANA"), _Var3)) break;
        }
        if (_raw_resist != (effect *)0x0) {
          flag_off(spells,0xd,(uint)_lowest_resist->index);
        }
      }
      else {
        iVar4 = 100 - el[_raw_resist->subtype].res_level;
        if (((backup[0xc] & 1) != 0) && (iVar4 <= (int)backup._5_4_)) {
          backup._5_4_ = iVar4;
          flag_on_dbg(&local_4d,0xd,(uint)_lowest_resist->index,"backup","info->index");
        }
        uVar5 = Rand_div(100);
        if ((int)uVar5 < iVar4) {
          flag_off(spells,0xd,(uint)_lowest_resist->index);
        }
      }
    }
    _lowest_resist = _lowest_resist + 1;
  } while( true );
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);
	int lowest_resist = RES_LEVEL_BASE;
	bitflag backup[RSF_SIZE];
	int restore_chance = 0;

	rsf_wipe(backup);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int raw_resist = RES_LEVEL_BASE - el[element].res_level;

			/* Smart monsters keep a backup */
			if (smart && (raw_resist <= lowest_resist)) {
				lowest_resist = raw_resist;
				rsf_on(backup, info->index);
			}

			/* High resist means more likely to drop the spell */
			if (randint0(100) < raw_resist) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level <= RES_LEVEL_EFFECT) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level > RES_LEVEL_BASE) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}

	/* Smart monsters re-assess dropped elemental spells */
	restore_chance = 1 + rsf_count(spells);
	if (smart && one_in_(restore_chance)) {
		for (info = mon_spell_types; info->index < RSF_MAX; info++) {
			const struct monster_spell *spell =
				monster_spell_by_index(info->index);
			int element;
			if (!spell) continue;
			if (!rsf_has(backup, info->index)) continue;
			element = spell->effect->subtype;
			if (RES_LEVEL_BASE - el[element].res_level == lowest_resist) {
				rsf_on(spells, info->index);
			}
		}
	}
}